

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O2

void __thiscall
Assimp::IRRImporter::ComputeAnimations
          (IRRImporter *this,Node *root,aiNode *real,
          vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *anims)

{
  char *__s;
  list<Assimp::IRRImporter::Animator,_std::allocator<Assimp::IRRImporter::Animator>_> *plVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  aiNode *paVar5;
  long lVar6;
  _List_node_base *p_Var7;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *pvVar8;
  undefined4 fYaw;
  uint i;
  ai_uint32 aVar9;
  uint uVar10;
  Logger *pLVar11;
  aiNode *paVar12;
  aiNode *this_00;
  ulong uVar13;
  aiNode **ppaVar14;
  undefined8 *puVar15;
  undefined1 (*pauVar16) [16];
  void *pvVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  undefined8 *puVar21;
  double dVar22;
  aiVector3t<float> *v1;
  aiVector3t<float> *paVar23;
  uint uVar24;
  char *pcVar25;
  uint i_1;
  iterator it;
  _List_node_base *p_Var26;
  float fVar27;
  undefined4 extraout_XMM0_Db;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  aiVector3t<float> aVar31;
  aiVector3t<float> local_158;
  aiNode *local_148;
  ulong local_140;
  aiQuaterniont<float> local_138;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  Node *local_118;
  uint local_10c;
  undefined8 local_108;
  IRRImporter *local_f0;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *local_e8;
  long local_e0;
  ulong local_d8;
  uint local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  undefined8 local_b8;
  aiNode *local_a0;
  undefined8 local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  
  local_f0 = this;
  if ((root == (Node *)0x0) || (real == (aiNode *)0x0)) {
    __assert_fail("nullptr != root && nullptr != real",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Irr/IRRLoader.cpp"
                  ,0x137,
                  "void Assimp::IRRImporter::ComputeAnimations(Node *, aiNode *, std::vector<aiNodeAnim *> &)"
                 );
  }
  plVar1 = &root->animators;
  p_Var26 = (root->animators).
            super__List_base<Assimp::IRRImporter::Animator,_std::allocator<Assimp::IRRImporter::Animator>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var26 != (_List_node_base *)plVar1) {
    local_140 = 0;
    for (; p_Var26 != (_List_node_base *)plVar1; p_Var26 = p_Var26->_M_next) {
      if ((*(int *)&p_Var26[1]._M_next == 5) || (*(int *)&p_Var26[1]._M_next == 0)) {
        pLVar11 = DefaultLogger::get();
        Logger::warn(pLVar11,"IRR: Skipping unknown or unsupported animator");
      }
      else {
        local_140 = (ulong)((int)local_140 + 1);
      }
    }
    if ((int)local_140 != 0) {
      if ((int)local_140 == 1) {
        pLVar11 = DefaultLogger::get();
        Logger::warn(pLVar11,"IRR: Adding dummy nodes to simulate multiple animators");
      }
      local_10c = 0;
      p_Var26 = (_List_node_base *)plVar1;
      while (p_Var26 = (((_List_base<Assimp::IRRImporter::Animator,_std::allocator<Assimp::IRRImporter::Animator>_>
                          *)&p_Var26->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var26 != (_List_node_base *)plVar1) {
        if ((*(int *)&p_Var26[1]._M_next != 0) && (*(int *)&p_Var26[1]._M_next != 5)) {
          local_e8 = anims;
          paVar12 = (aiNode *)operator_new(0x438);
          (paVar12->mName).length = 0;
          __s = (paVar12->mName).data;
          (paVar12->mName).data[0] = '\0';
          memset((paVar12->mName).data + 1,0x1b,0x3ff);
          (paVar12->mTransformation).b2 = 0.0;
          (paVar12->mTransformation).b3 = 0.0;
          (paVar12->mTransformation).b4 = 0.0;
          (paVar12->mTransformation).a1 = 0.0;
          (paVar12->mTransformation).a2 = 0.0;
          (paVar12->mTransformation).a3 = 0.0;
          (paVar12->mTransformation).a4 = 0.0;
          (paVar12->mTransformation).c2 = 0.0;
          (paVar12->mTransformation).c3 = 0.0;
          (paVar12->mTransformation).c4 = 0.0;
          (paVar12->mTransformation).d1 = 0.0;
          uVar18 = (int)local_140 - 1;
          uVar13 = (root->name)._M_string_length;
          local_148 = paVar12;
          local_118 = root;
          if (local_10c == uVar18) {
            if (uVar13 < 0x400) {
              (paVar12->mName).length = (ai_uint32)uVar13;
              memcpy(__s,(root->name)._M_dataplus._M_p,uVar13);
              (paVar12->mName).data[uVar13] = '\0';
            }
          }
          else {
            pcVar25 = "";
            if (uVar13 != 0) {
              pcVar25 = (root->name)._M_dataplus._M_p;
            }
            aVar9 = snprintf(__s,0x400,"$INST_DUMMY_%i_%s",(ulong)uVar18,pcVar25);
            (local_148->mName).length = aVar9;
            this_00 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(this_00);
            paVar12 = local_148;
            for (uVar13 = 0; paVar5 = real->mParent, uVar13 < paVar5->mNumChildren;
                uVar13 = uVar13 + 1) {
              if (paVar5->mChildren[uVar13] == real) {
                paVar5->mChildren[uVar13] = this_00;
              }
            }
            this_00->mParent = paVar5;
            if (this_00 != local_148) {
              uVar18 = (local_148->mName).length;
              (this_00->mName).length = uVar18;
              memcpy((this_00->mName).data,(local_148->mName).data,(ulong)uVar18);
              (this_00->mName).data[uVar18] = '\0';
            }
            this_00->mNumChildren = 1;
            ppaVar14 = (aiNode **)operator_new__(8);
            this_00->mChildren = ppaVar14;
            *ppaVar14 = real;
            real->mParent = this_00;
          }
          local_a0 = real;
          switch(*(undefined4 *)&p_Var26[1]._M_next) {
          case 1:
            local_158.x = (float)((int)(SUB84(p_Var26[1]._M_prev,0) * 100.0) % 0x168);
            local_158.y = (float)((int)((float)((ulong)p_Var26[1]._M_prev >> 0x20) * 100.0) % 0x168)
            ;
            local_158.z = (float)((int)(*(float *)&p_Var26[2]._M_next * 100.0) % 0x168);
            fVar27 = local_158.x;
            if (((int)local_158.x * (int)local_158.y != 0) &&
               ((int)local_158.z * (int)local_158.y != 0)) {
              FindSuitableMultiple((int *)&local_158);
              FindSuitableMultiple((int *)&local_158.y);
              FindSuitableMultiple((int *)&local_158.z);
              fVar27 = local_158.x;
            }
            if (fVar27 == 0.0) {
              iVar20 = 0x168;
            }
            else {
              iVar20 = Math::lcm<int>(0x168,(int)fVar27);
            }
            if (local_158.y != 0.0) {
              iVar20 = Math::lcm<int>(iVar20,(int)local_158.y);
            }
            if (local_158.z != 0.0) {
              iVar20 = Math::lcm<int>(iVar20,(int)local_158.z);
            }
            paVar12 = local_148;
            if (iVar20 != 0x168) {
              fVar27 = (float)iVar20;
              fVar29 = 0.0;
              if (local_158.x != 0.0) {
                fVar29 = fVar27 / (float)(int)local_158.x;
              }
              fVar28 = fVar29;
              if ((local_158.y != 0.0) &&
                 (fVar28 = fVar27 / (float)(int)local_158.y,
                 fVar27 / (float)(int)local_158.y <= fVar29)) {
                fVar28 = fVar29;
              }
              fVar29 = fVar28;
              if ((local_158.z != 0.0) &&
                 (fVar29 = fVar27 / (float)(int)local_158.z,
                 fVar27 / (float)(int)local_158.z <= fVar28)) {
                fVar29 = fVar28;
              }
              uVar13 = (ulong)((double)fVar29 * local_f0->fps);
              fVar27 = (float)uVar13;
              (local_148->mTransformation).a4 = fVar27;
              uVar13 = uVar13 & 0xffffffff;
              puVar15 = (undefined8 *)operator_new__(uVar13 * 0x18);
              if (fVar27 != 0.0) {
                puVar21 = puVar15;
                do {
                  *puVar21 = 0;
                  *(undefined1 (*) [16])(puVar21 + 1) = ZEXT416(0x3f800000);
                  puVar21 = puVar21 + 3;
                } while (puVar21 != puVar15 + uVar13 * 3);
              }
              *(undefined8 **)&(paVar12->mTransformation).b2 = puVar15;
              auVar30 = ZEXT816(0);
              fVar27 = 0.0;
              lVar19 = 8;
              for (uVar13 = 0; uVar13 < (uint)(paVar12->mTransformation).a4; uVar13 = uVar13 + 1) {
                lVar6 = *(long *)&(paVar12->mTransformation).b2;
                local_128._0_4_ = auVar30._0_4_;
                local_108 = (double)CONCAT44(local_108._4_4_,fVar27);
                fYaw = local_128._0_4_;
                _local_128 = auVar30;
                aiQuaterniont<float>::aiQuaterniont(&local_138,fVar27,(float)fYaw,auVar30._4_4_);
                puVar15 = (undefined8 *)(lVar6 + lVar19);
                *puVar15 = local_138._0_8_;
                puVar15[1] = CONCAT44(local_138.z,local_138.y);
                *(double *)(lVar6 + -8 + lVar19) = (double)(uVar13 & 0xffffffff);
                fVar27 = (float)local_108 + *(float *)&p_Var26[1]._M_prev;
                uVar3 = *(undefined8 *)((long)&p_Var26[1]._M_prev + 4);
                auVar30._0_4_ = (float)local_128._0_4_ + (float)uVar3;
                auVar30._4_4_ = (float)local_128._4_4_ + (float)((ulong)uVar3 >> 0x20);
                auVar30._8_4_ = fStack_120 + 0.0;
                auVar30._12_4_ = fStack_11c + 0.0;
                lVar19 = lVar19 + 0x18;
                paVar12 = local_148;
              }
              (paVar12->mTransformation).c4 = 4.2039e-45;
              (paVar12->mTransformation).d1 = 4.2039e-45;
            }
            break;
          case 2:
            local_128 = (undefined1  [8])local_f0->fps;
            uVar13 = (ulong)(((1.0 / (double)*(float *)((long)&p_Var26[1]._M_next + 4)) / 1000.0) *
                            local_f0->fps);
            fVar27 = (float)uVar13;
            (paVar12->mTransformation).a1 = fVar27;
            uVar13 = (uVar13 & 0xffffffff) * 0x18;
            pvVar17 = operator_new__(uVar13);
            if (fVar27 != 0.0) {
              lVar19 = 0;
              do {
                *(undefined4 *)((long)pvVar17 + lVar19 + 0x10) = 0;
                *(undefined8 *)((long)pvVar17 + lVar19) = 0;
                ((undefined8 *)((long)pvVar17 + lVar19))[1] = 0;
                lVar19 = lVar19 + 0x18;
              } while (uVar13 - lVar19 != 0);
            }
            *(void **)&(paVar12->mTransformation).a2 = pvVar17;
            local_138.w = 0.0;
            local_138.x = 0.0;
            local_138.y = 0.0;
            fVar27 = *(float *)((long)&p_Var26[1]._M_prev + 4);
            if ((fVar27 != 0.0) || (NAN(fVar27))) {
              local_158.x = 50.0;
              local_158.y = 0.0;
            }
            else {
              local_158.x = 0.0;
              local_158.y = 50.0;
            }
            local_158.z = 0.0;
            aVar31 = operator^(&local_158,(aiVector3t<float> *)&p_Var26[1]._M_prev);
            local_b8 = 1000.0 / (double)local_128;
            local_138._0_8_ = aVar31._0_8_;
            local_138.y = aVar31.z;
            aiVector3t<float>::Normalize((aiVector3t<float> *)&local_138);
            local_158 = operator^((aiVector3t<float> *)&local_138,
                                  (aiVector3t<float> *)&p_Var26[1]._M_prev);
            paVar23 = aiVector3t<float>::Normalize(&local_158);
            uVar2 = paVar23->x;
            uVar4 = paVar23->y;
            local_78._4_4_ = uVar4;
            local_78._0_4_ = uVar2;
            local_78._8_8_ = 0;
            local_88._0_4_ = paVar23->z;
            lVar19 = 0x10;
            for (uVar13 = 0; uVar13 < (uint)(local_148->mTransformation).a1; uVar13 = uVar13 + 1) {
              lVar6 = *(long *)&(local_148->mTransformation).a2;
              dVar22 = (double)(uVar13 & 0xffffffff) * local_b8;
              *(double *)(lVar6 + -0x10 + lVar19) = dVar22;
              fVar27 = (float)((double)*(float *)((long)&p_Var26[1]._M_next + 4) * dVar22);
              local_e0 = CONCAT44(local_e0._4_4_,fVar27);
              _local_128 = ZEXT416(*(uint *)&p_Var26[3]._M_next);
              fVar27 = cosf(fVar27);
              local_108 = (double)CONCAT44(extraout_XMM0_Db,fVar27);
              local_d8 = CONCAT44(local_d8._4_4_,(float)local_88._0_4_ * fVar27);
              fVar27 = sinf((float)local_e0);
              local_158.y = (float)local_128._0_4_ *
                            (fVar27 * local_138.x + (float)local_108 * (float)local_78._4_4_);
              local_158.x = (float)local_128._0_4_ *
                            (fVar27 * local_138.w + (float)local_108 * (float)local_78._0_4_);
              local_158.z = (local_138.y * fVar27 + (float)local_d8) * (float)local_128._0_4_;
              aVar31 = ::operator+((aiVector3t<float> *)((long)&p_Var26[2]._M_next + 4),&local_158);
              *(long *)(lVar6 + -8 + lVar19) = aVar31._0_8_;
              *(float *)(lVar6 + lVar19) = aVar31.z;
              lVar19 = lVar19 + 0x18;
            }
            (local_148->mTransformation).c4 = 4.2039e-45;
            (local_148->mTransformation).d1 = 4.2039e-45;
            break;
          case 3:
            fVar27 = (float)((uint)*(byte *)&p_Var26[5]._M_next * 2 + 1);
            (paVar12->mTransformation).c4 = fVar27;
            (paVar12->mTransformation).d1 = fVar27;
            local_128 = (undefined1  [8])local_f0->fps;
            uVar13 = (ulong)(((double)*(int *)((long)&p_Var26[5]._M_next + 4) / 1000.0) *
                            (double)local_128);
            fVar27 = (float)uVar13;
            (paVar12->mTransformation).a1 = fVar27;
            uVar13 = (uVar13 & 0xffffffff) * 0x18;
            pvVar17 = operator_new__(uVar13);
            if (fVar27 != 0.0) {
              lVar19 = 0;
              do {
                *(undefined4 *)((long)pvVar17 + lVar19 + 0x10) = 0;
                *(undefined8 *)((long)pvVar17 + lVar19) = 0;
                ((undefined8 *)((long)pvVar17 + lVar19))[1] = 0;
                lVar19 = lVar19 + 0x18;
              } while (uVar13 - lVar19 != 0);
            }
            local_128 = (undefined1  [8])(1000.0 / (double)local_128);
            *(void **)&(paVar12->mTransformation).a2 = pvVar17;
            paVar23 = (aiVector3t<float> *)((long)&p_Var26[2]._M_next + 4);
            aVar31 = operator-((aiVector3t<float> *)&p_Var26[1]._M_prev,paVar23);
            local_138.y = aVar31.z;
            local_138._0_8_ = aVar31._0_8_;
            local_108 = (double)CONCAT44(local_108._4_4_,
                                         SQRT(local_138.y * local_138.y +
                                              aVar31.x * aVar31.x + aVar31.y * aVar31.y));
            aiVector3t<float>::Normalize((aiVector3t<float> *)&local_138);
            local_108 = (double)((float)local_108 / (float)*(int *)((long)&p_Var26[5]._M_next + 4));
            lVar19 = 0x10;
            for (uVar13 = 0; uVar13 < (uint)(local_148->mTransformation).a1; uVar13 = uVar13 + 1) {
              lVar6 = *(long *)&(local_148->mTransformation).a2;
              dVar22 = (double)(uVar13 & 0xffffffff) * (double)local_128;
              *(double *)(lVar6 + -0x10 + lVar19) = dVar22;
              fVar27 = (float)(dVar22 * local_108);
              local_158.y = fVar27 * local_138.x;
              local_158.x = fVar27 * local_138.w;
              local_158.z = fVar27 * local_138.y;
              aVar31 = ::operator+(paVar23,&local_158);
              *(long *)(lVar6 + -8 + lVar19) = aVar31._0_8_;
              *(float *)(lVar6 + lVar19) = aVar31.z;
              lVar19 = lVar19 + 0x18;
            }
            break;
          case 4:
            (paVar12->mTransformation).c4 = 4.2039e-45;
            (paVar12->mTransformation).d1 = 4.2039e-45;
            uVar18 = (uint)(((long)p_Var26[4]._M_next - (long)p_Var26[3]._M_prev) / 0x18);
            if (uVar18 == 1) {
              (paVar12->mTransformation).a1 = 1.4013e-45;
              pauVar16 = (undefined1 (*) [16])operator_new__(0x18);
              *(undefined4 *)pauVar16[1] = 0;
              *pauVar16 = (undefined1  [16])0x0;
              *(undefined1 (**) [16])&(paVar12->mTransformation).a2 = pauVar16;
              p_Var7 = p_Var26[3]._M_prev;
              *(_List_node_base **)(*pauVar16 + 8) = p_Var7->_M_prev;
              *(undefined4 *)pauVar16[1] = *(undefined4 *)&p_Var7[1]._M_next;
              **(undefined8 **)&(paVar12->mTransformation).a2 = 0;
              break;
            }
            if (uVar18 != 0) {
              uVar13 = (ulong)(local_f0->fps * 15.0);
              fVar27 = (float)uVar13;
              (paVar12->mTransformation).a1 = fVar27;
              uVar13 = (uVar13 & 0xffffffff) * 0x18;
              pvVar17 = operator_new__(uVar13);
              if (fVar27 != 0.0) {
                lVar19 = 0;
                do {
                  *(undefined4 *)((long)pvVar17 + lVar19 + 0x10) = 0;
                  *(undefined8 *)((long)pvVar17 + lVar19) = 0;
                  ((undefined8 *)((long)pvVar17 + lVar19))[1] = 0;
                  lVar19 = lVar19 + 0x18;
                } while (uVar13 - lVar19 != 0);
              }
              *(void **)&(paVar12->mTransformation).a2 = pvVar17;
              local_cc = -((int)uVar18 >> 0x1f & uVar18);
              lVar19 = 0x10;
              dVar22 = 0.0;
              while ((ulong)dVar22 < (ulong)(uint)(paVar12->mTransformation).a1) {
                local_d8 = (ulong)dVar22 & 0xffffffff;
                local_e0._0_4_ = (paVar12->mTransformation).a2;
                local_e0._4_4_ = (paVar12->mTransformation).a3;
                fVar27 = (float)local_d8 * *(float *)((long)&p_Var26[1]._M_next + 4) * 0.001;
                local_b8 = (double)CONCAT44(local_b8._4_4_,fVar27);
                local_128 = (undefined1  [8])lVar19;
                local_108 = dVar22;
                fVar27 = floorf(fVar27);
                iVar20 = (int)fVar27 % (int)uVar18;
                uVar10 = local_cc;
                if (iVar20 < 1) {
                  uVar10 = uVar18;
                }
                p_Var7 = p_Var26[3]._M_prev;
                uVar24 = local_cc;
                if (iVar20 < 0) {
                  uVar24 = uVar18;
                }
                paVar23 = (aiVector3t<float> *)
                          ((long)p_Var7 + (long)(int)(uVar24 + iVar20) * 0x18 + 8);
                uVar24 = uVar18;
                if (iVar20 + 1 < (int)uVar18) {
                  uVar24 = 0;
                }
                uVar24 = -uVar24;
                if (iVar20 < -1) {
                  uVar24 = uVar18;
                }
                v1 = (aiVector3t<float> *)
                     ((long)p_Var7 + (long)(int)(uVar24 + iVar20 + 1) * 0x18 + 8);
                uVar24 = uVar18;
                if (iVar20 + 2 < (int)uVar18) {
                  uVar24 = 0;
                }
                uVar24 = -uVar24;
                if (iVar20 < -2) {
                  uVar24 = uVar18;
                }
                fVar27 = ((float)local_b8 - fVar27) * ((float)local_b8 - fVar27);
                fVar29 = fVar27 + fVar27;
                local_98 = CONCAT44(local_98._4_4_,fVar29 + fVar29 + fVar27 * -3.0 + 1.0);
                local_bc = fVar29 * 3.0 + fVar29 * -2.0;
                local_88 = ZEXT416((uint)(fVar29 * -2.0 + fVar29));
                local_78 = ZEXT416((uint)(fVar29 - fVar27));
                aVar31 = operator-(v1,(aiVector3t<float> *)
                                      ((long)p_Var7 + (long)(int)(iVar20 + -1 + uVar10) * 0x18 + 8))
                ;
                local_b8 = aVar31._0_8_;
                local_c0 = *(float *)((long)&p_Var26[3]._M_next + 4);
                local_58 = ZEXT416((uint)local_c0);
                local_c0 = aVar31.z * local_c0;
                aVar31 = operator-((aiVector3t<float> *)
                                   ((long)p_Var7 + (long)(int)(uVar24 + iVar20 + 2) * 0x18 + 8),
                                   paVar23);
                local_48 = aVar31._0_8_;
                local_c4 = *(float *)((long)&p_Var26[3]._M_next + 4);
                local_68 = ZEXT416((uint)local_c4);
                local_c4 = aVar31.z * local_c4;
                aVar31 = ::operator*((float)local_98,paVar23);
                local_c8 = aVar31.z;
                local_98 = aVar31._0_8_;
                aVar31 = ::operator*(v1,local_bc);
                *(ulong *)(local_e0 + -8 + (long)local_128) =
                     CONCAT44((float)local_78._0_4_ * (float)local_68._0_4_ * local_48._4_4_ +
                              (float)local_88._0_4_ * (float)local_58._0_4_ * local_b8._4_4_ +
                              aVar31.y + local_98._4_4_,
                              (float)local_78._0_4_ * (float)local_68._0_4_ * (float)local_48 +
                              (float)local_88._0_4_ * (float)local_58._0_4_ * (float)local_b8 +
                              aVar31.x + (float)local_98);
                *(float *)(local_e0 + (long)local_128) =
                     local_c4 * (float)local_78._0_4_ +
                     local_c0 * (float)local_88._0_4_ + aVar31.z + local_c8;
                *(double *)(local_e0 + -0x10 + (long)local_128) = (double)(long)local_d8;
                lVar19 = (long)local_128 + 0x18;
                paVar12 = local_148;
                dVar22 = (double)((long)local_108 + 1);
              }
              goto LAB_00412779;
            }
            pLVar11 = DefaultLogger::get();
            Logger::warn(pLVar11,"IRR: Spline animators with no points defined");
            paVar12 = local_148;
            if (local_148 != (aiNode *)0x0) {
              aiNodeAnim::~aiNodeAnim((aiNodeAnim *)local_148);
            }
            operator_delete(paVar12,0x438);
            goto LAB_004127a6;
          }
          real = local_a0;
          if (local_148 != (aiNode *)0x0) {
LAB_00412779:
            pvVar8 = local_e8;
            std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back
                      (local_e8,(value_type *)&local_148);
            local_140 = (ulong)((int)local_140 + 1);
            local_e8 = pvVar8;
            real = local_a0;
          }
LAB_004127a6:
          local_10c = local_10c + 1;
          root = local_118;
          anims = local_e8;
        }
      }
    }
  }
  return;
}

Assistant:

void IRRImporter::ComputeAnimations(Node* root, aiNode* real, std::vector<aiNodeAnim*>& anims)
{
    ai_assert(nullptr != root && nullptr != real);

    // XXX totally WIP - doesn't produce proper results, need to evaluate
    // whether there's any use for Irrlicht's proprietary scene format
    // outside Irrlicht ...
    // This also applies to the above function of FindSuitableMultiple and ClampSpline which are
    // solely used in this function

    if (root->animators.empty()) {
        return;
    }
    unsigned int total( 0 );
    for (std::list<Animator>::iterator it = root->animators.begin();it != root->animators.end(); ++it)  {
        if ((*it).type == Animator::UNKNOWN || (*it).type == Animator::OTHER)   {
            ASSIMP_LOG_WARN("IRR: Skipping unknown or unsupported animator");
            continue;
        }
        ++total;
    }
    if (!total) {
        return;
    } else if (1 == total)    {
        ASSIMP_LOG_WARN("IRR: Adding dummy nodes to simulate multiple animators");
    }

    // NOTE: 1 tick == i millisecond

    unsigned int cur = 0;
    for (std::list<Animator>::iterator it = root->animators.begin();
        it != root->animators.end(); ++it)
    {
        if ((*it).type == Animator::UNKNOWN || (*it).type == Animator::OTHER)continue;

        Animator& in = *it ;
        aiNodeAnim* anim = new aiNodeAnim();

        if (cur != total-1) {
            // Build a new name - a prefix instead of a suffix because it is
            // easier to check against
            anim->mNodeName.length = ::ai_snprintf(anim->mNodeName.data, MAXLEN,
                "$INST_DUMMY_%i_%s",total-1,
                (root->name.length() ? root->name.c_str() : ""));

            // we'll also need to insert a dummy in the node hierarchy.
            aiNode* dummy = new aiNode();

            for (unsigned int i = 0; i < real->mParent->mNumChildren;++i)
                if (real->mParent->mChildren[i] == real)
                    real->mParent->mChildren[i] = dummy;

            dummy->mParent = real->mParent;
            dummy->mName = anim->mNodeName;

            dummy->mNumChildren = 1;
            dummy->mChildren = new aiNode*[dummy->mNumChildren];
            dummy->mChildren[0] = real;

            // the transformation matrix of the dummy node is the identity

            real->mParent = dummy;
        }
        else anim->mNodeName.Set(root->name);
        ++cur;

        switch (in.type)    {
        case Animator::ROTATION:
            {
                // -----------------------------------------------------
                // find out how long a full rotation will take
                // This is the least common multiple of 360.f and all
                // three euler angles. Although we'll surely find a
                // possible multiple (haha) it could be somewhat large
                // for our purposes. So we need to modify the angles
                // here in order to get good results.
                // -----------------------------------------------------
                int angles[3];
                angles[0] = (int)(in.direction.x*100);
                angles[1] = (int)(in.direction.y*100);
                angles[2] = (int)(in.direction.z*100);

                angles[0] %= 360;
                angles[1] %= 360;
                angles[2] %= 360;

                if ( (angles[0]*angles[1]) != 0 && (angles[1]*angles[2]) != 0 )
                {
                    FindSuitableMultiple(angles[0]);
                    FindSuitableMultiple(angles[1]);
                    FindSuitableMultiple(angles[2]);
                }

                int lcm = 360;

                if (angles[0])
                    lcm  = Math::lcm(lcm,angles[0]);

                if (angles[1])
                    lcm  = Math::lcm(lcm,angles[1]);

                if (angles[2])
                    lcm  = Math::lcm(lcm,angles[2]);

                if (360 == lcm)
                    break;

#if 0
                // This can be a division through zero, but we don't care
                float f1 = (float)lcm / angles[0];
                float f2 = (float)lcm / angles[1];
                float f3 = (float)lcm / angles[2];
#endif

                // find out how many time units we'll need for the finest
                // track (in seconds) - this defines the number of output
                // keys (fps * seconds)
                float max  = 0.f;
                if (angles[0])
                    max = (float)lcm / angles[0];
                if (angles[1])
                    max = std::max(max, (float)lcm / angles[1]);
                if (angles[2])
                    max = std::max(max, (float)lcm / angles[2]);

                anim->mNumRotationKeys = (unsigned int)(max*fps);
                anim->mRotationKeys = new aiQuatKey[anim->mNumRotationKeys];

                // begin with a zero angle
                aiVector3D angle;
                for (unsigned int i = 0; i < anim->mNumRotationKeys;++i)
                {
                    // build the quaternion for the given euler angles
                    aiQuatKey& q = anim->mRotationKeys[i];

                    q.mValue = aiQuaternion(angle.x, angle.y, angle.z);
                    q.mTime = (double)i;

                    // increase the angle
                    angle += in.direction;
                }

                // This animation is repeated and repeated ...
                anim->mPostState = anim->mPreState = aiAnimBehaviour_REPEAT;
            }
            break;

        case Animator::FLY_CIRCLE:
            {
                // -----------------------------------------------------
                // Find out how much time we'll need to perform a
                // full circle.
                // -----------------------------------------------------
                const double seconds = (1. / in.speed) / 1000.;
                const double tdelta = 1000. / fps;

                anim->mNumPositionKeys = (unsigned int) (fps * seconds);
                anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];

                // from Irrlicht, what else should we do than copying it?
                aiVector3D vecU,vecV;
                if (in.direction.y) {
                    vecV = aiVector3D(50,0,0) ^ in.direction;
                }
                else vecV = aiVector3D(0,50,00) ^ in.direction;
                vecV.Normalize();
                vecU = (vecV ^ in.direction).Normalize();

                // build the output keys
                for (unsigned int i = 0; i < anim->mNumPositionKeys;++i)    {
                    aiVectorKey& key = anim->mPositionKeys[i];
                    key.mTime = i * tdelta;

                    const ai_real t = (ai_real) ( in.speed * key.mTime );
                    key.mValue = in.circleCenter  + in.circleRadius * ((vecU * std::cos(t)) + (vecV * std::sin(t)));
                }

                // This animation is repeated and repeated ...
                anim->mPostState = anim->mPreState = aiAnimBehaviour_REPEAT;
            }
            break;

        case Animator::FLY_STRAIGHT:
            {
                anim->mPostState = anim->mPreState = (in.loop ? aiAnimBehaviour_REPEAT : aiAnimBehaviour_CONSTANT);
                const double seconds = in.timeForWay / 1000.;
                const double tdelta = 1000. / fps;

                anim->mNumPositionKeys = (unsigned int) (fps * seconds);
                anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];

                aiVector3D diff = in.direction - in.circleCenter;
                const ai_real lengthOfWay = diff.Length();
                diff.Normalize();

                const double timeFactor = lengthOfWay / in.timeForWay;

                // build the output keys
                for (unsigned int i = 0; i < anim->mNumPositionKeys;++i)    {
                    aiVectorKey& key = anim->mPositionKeys[i];
                    key.mTime = i * tdelta;
                    key.mValue = in.circleCenter + diff * ai_real(timeFactor * key.mTime);
                }
            }
            break;

        case Animator::FOLLOW_SPLINE:
            {
                // repeat outside the defined time range
                anim->mPostState = anim->mPreState = aiAnimBehaviour_REPEAT;
                const int size = (int)in.splineKeys.size();
                if (!size)  {
                    // We have no point in the spline. That's bad. Really bad.
                    ASSIMP_LOG_WARN("IRR: Spline animators with no points defined");

                    delete anim;
                    anim = nullptr;
                    break;
                }
                else if (size == 1) {
                    // We have just one point in the spline so we don't need the full calculation
                    anim->mNumPositionKeys = 1;
                    anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];

                    anim->mPositionKeys[0].mValue = in.splineKeys[0].mValue;
                    anim->mPositionKeys[0].mTime  = 0.f;
                    break;
                }

                unsigned int ticksPerFull = 15;
                anim->mNumPositionKeys = (unsigned int) ( ticksPerFull * fps );
                anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];

                for (unsigned int i = 0; i < anim->mNumPositionKeys;++i)
                {
                    aiVectorKey& key = anim->mPositionKeys[i];

                    const ai_real dt = (i * in.speed * ai_real( 0.001 ) );
                    const ai_real u = dt - std::floor(dt);
                    const int idx = (int)std::floor(dt) % size;

                    // get the 4 current points to evaluate the spline
                    const aiVector3D& p0 = in.splineKeys[ ClampSpline( idx - 1, size ) ].mValue;
                    const aiVector3D& p1 = in.splineKeys[ ClampSpline( idx + 0, size ) ].mValue;
                    const aiVector3D& p2 = in.splineKeys[ ClampSpline( idx + 1, size ) ].mValue;
                    const aiVector3D& p3 = in.splineKeys[ ClampSpline( idx + 2, size ) ].mValue;

                    // compute polynomials
                    const ai_real u2 = u*u;
                    const ai_real u3 = u2*2;

                    const ai_real h1 = ai_real( 2.0 ) * u3 - ai_real( 3.0 ) * u2 + ai_real( 1.0 );
                    const ai_real h2 = ai_real( -2.0 ) * u3 + ai_real( 3.0 ) * u3;
                    const ai_real h3 = u3 - ai_real( 2.0 ) * u3;
                    const ai_real h4 = u3 - u2;

                    // compute the spline tangents
                    const aiVector3D t1 = ( p2 - p0 ) * in.tightness;
                    aiVector3D t2 = ( p3 - p1 ) * in.tightness;

                    // and use them to get the interpolated point
                    t2 = (h1 * p1 + p2 * h2 + t1 * h3 + h4 * t2);

                    // build a simple translation matrix from it
                    key.mValue = t2;
                    key.mTime  = (double) i;
                }
            }
            break;
        default:
            // UNKNOWN , OTHER
            break;
        };
        if (anim)   {
            anims.push_back(anim);
            ++total;
        }
    }
}